

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_map.hpp
# Opt level: O0

pair<__gnu_cxx::__normal_iterator<std::pair<Rml::EventId,_Rml::EventListener_*>_*,_std::vector<std::pair<Rml::EventId,_Rml::EventListener_*>,_std::allocator<std::pair<Rml::EventId,_Rml::EventListener_*>_>_>_>,_bool>
 __thiscall
itlib::
flat_map<Rml::EventId,Rml::EventListener*,itlib::fmimpl::less,std::vector<std::pair<Rml::EventId,Rml::EventListener*>,std::allocator<std::pair<Rml::EventId,Rml::EventListener*>>>>
::insert<std::pair<Rml::EventId,Rml::EventListener*>>
          (flat_map<Rml::EventId,Rml::EventListener*,itlib::fmimpl::less,std::vector<std::pair<Rml::EventId,Rml::EventListener*>,std::allocator<std::pair<Rml::EventId,Rml::EventListener*>>>>
           *this,pair<Rml::EventId,_Rml::EventListener_*> *val)

{
  iterator a;
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  reference b;
  void *extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar3;
  __normal_iterator<std::pair<Rml::EventId,_Rml::EventListener_*>_*,_std::vector<std::pair<Rml::EventId,_Rml::EventListener_*>,_std::allocator<std::pair<Rml::EventId,_Rml::EventListener_*>_>_>_>
  *__rhs;
  pair<__gnu_cxx::__normal_iterator<std::pair<Rml::EventId,_Rml::EventListener_*>_*,_std::vector<std::pair<Rml::EventId,_Rml::EventListener_*>,_std::allocator<std::pair<Rml::EventId,_Rml::EventListener_*>_>_>_>,_bool>
  pVar4;
  byte local_52;
  bool local_51;
  const_iterator local_50;
  __normal_iterator<std::pair<Rml::EventId,_Rml::EventListener_*>_*,_std::vector<std::pair<Rml::EventId,_Rml::EventListener_*>,_std::allocator<std::pair<Rml::EventId,_Rml::EventListener_*>_>_>_>
  local_48;
  bool local_39;
  __normal_iterator<std::pair<Rml::EventId,_Rml::EventListener_*>_*,_std::vector<std::pair<Rml::EventId,_Rml::EventListener_*>,_std::allocator<std::pair<Rml::EventId,_Rml::EventListener_*>_>_>_>
  local_38;
  __normal_iterator<std::pair<Rml::EventId,_Rml::EventListener_*>_*,_std::vector<std::pair<Rml::EventId,_Rml::EventListener_*>,_std::allocator<std::pair<Rml::EventId,_Rml::EventListener_*>_>_>_>
  local_30;
  iterator i;
  pair<Rml::EventId,_Rml::EventListener_*> *val_local;
  flat_map<Rml::EventId,_Rml::EventListener_*,_itlib::fmimpl::less,_std::vector<std::pair<Rml::EventId,_Rml::EventListener_*>,_std::allocator<std::pair<Rml::EventId,_Rml::EventListener_*>_>_>_>
  *this_local;
  bool local_10;
  
  i._M_current = val;
  local_30._M_current =
       (pair<Rml::EventId,_Rml::EventListener_*> *)
       flat_map<Rml::EventId,_Rml::EventListener_*,_itlib::fmimpl::less,_std::vector<std::pair<Rml::EventId,_Rml::EventListener_*>,_std::allocator<std::pair<Rml::EventId,_Rml::EventListener_*>_>_>_>
       ::lower_bound<Rml::EventId>
                 ((flat_map<Rml::EventId,_Rml::EventListener_*,_itlib::fmimpl::less,_std::vector<std::pair<Rml::EventId,_Rml::EventListener_*>,_std::allocator<std::pair<Rml::EventId,_Rml::EventListener_*>_>_>_>
                   *)this,&val->first);
  local_38._M_current =
       (pair<Rml::EventId,_Rml::EventListener_*> *)
       flat_map<Rml::EventId,_Rml::EventListener_*,_itlib::fmimpl::less,_std::vector<std::pair<Rml::EventId,_Rml::EventListener_*>,_std::allocator<std::pair<Rml::EventId,_Rml::EventListener_*>_>_>_>
       ::end((flat_map<Rml::EventId,_Rml::EventListener_*,_itlib::fmimpl::less,_std::vector<std::pair<Rml::EventId,_Rml::EventListener_*>,_std::allocator<std::pair<Rml::EventId,_Rml::EventListener_*>_>_>_>
              *)this);
  __rhs = &local_38;
  bVar1 = __gnu_cxx::operator!=(&local_30,__rhs);
  local_52 = 0;
  if (bVar1) {
    iVar2 = flat_map<Rml::EventId,_Rml::EventListener_*,_itlib::fmimpl::less,_std::vector<std::pair<Rml::EventId,_Rml::EventListener_*>,_std::allocator<std::pair<Rml::EventId,_Rml::EventListener_*>_>_>_>
            ::cmp((flat_map<Rml::EventId,_Rml::EventListener_*,_itlib::fmimpl::less,_std::vector<std::pair<Rml::EventId,_Rml::EventListener_*>,_std::allocator<std::pair<Rml::EventId,_Rml::EventListener_*>_>_>_>
                   *)this,__rhs,extraout_RDX);
    a = i;
    b = __gnu_cxx::
        __normal_iterator<std::pair<Rml::EventId,_Rml::EventListener_*>_*,_std::vector<std::pair<Rml::EventId,_Rml::EventListener_*>,_std::allocator<std::pair<Rml::EventId,_Rml::EventListener_*>_>_>_>
        ::operator*(&local_30);
    bVar1 = fmimpl::pair_compare<Rml::EventId,Rml::EventListener*,itlib::fmimpl::less>::operator()
                      ((void *)CONCAT44(extraout_var,iVar2),&(a._M_current)->first,b);
    local_52 = bVar1 ^ 0xff;
  }
  if ((local_52 & 1) == 0) {
    __gnu_cxx::
    __normal_iterator<std::pair<Rml::EventId,Rml::EventListener*>const*,std::vector<std::pair<Rml::EventId,Rml::EventListener*>,std::allocator<std::pair<Rml::EventId,Rml::EventListener*>>>>
    ::__normal_iterator<std::pair<Rml::EventId,Rml::EventListener*>*>
              ((__normal_iterator<std::pair<Rml::EventId,Rml::EventListener*>const*,std::vector<std::pair<Rml::EventId,Rml::EventListener*>,std::allocator<std::pair<Rml::EventId,Rml::EventListener*>>>>
                *)&local_50,&local_30);
    local_48._M_current =
         (pair<Rml::EventId,_Rml::EventListener_*> *)
         std::
         vector<std::pair<Rml::EventId,Rml::EventListener*>,std::allocator<std::pair<Rml::EventId,Rml::EventListener*>>>
         ::emplace<std::pair<Rml::EventId,Rml::EventListener*>>
                   ((vector<std::pair<Rml::EventId,Rml::EventListener*>,std::allocator<std::pair<Rml::EventId,Rml::EventListener*>>>
                     *)this,local_50,i._M_current);
    local_51 = true;
    std::
    pair<__gnu_cxx::__normal_iterator<std::pair<Rml::EventId,_Rml::EventListener_*>_*,_std::vector<std::pair<Rml::EventId,_Rml::EventListener_*>,_std::allocator<std::pair<Rml::EventId,_Rml::EventListener_*>_>_>_>,_bool>
    ::
    pair<__gnu_cxx::__normal_iterator<std::pair<Rml::EventId,_Rml::EventListener_*>_*,_std::vector<std::pair<Rml::EventId,_Rml::EventListener_*>,_std::allocator<std::pair<Rml::EventId,_Rml::EventListener_*>_>_>_>,_bool,_true>
              ((pair<__gnu_cxx::__normal_iterator<std::pair<Rml::EventId,_Rml::EventListener_*>_*,_std::vector<std::pair<Rml::EventId,_Rml::EventListener_*>,_std::allocator<std::pair<Rml::EventId,_Rml::EventListener_*>_>_>_>,_bool>
                *)&this_local,&local_48,&local_51);
    uVar3 = extraout_RDX_01;
  }
  else {
    local_39 = false;
    std::
    pair<__gnu_cxx::__normal_iterator<std::pair<Rml::EventId,_Rml::EventListener_*>_*,_std::vector<std::pair<Rml::EventId,_Rml::EventListener_*>,_std::allocator<std::pair<Rml::EventId,_Rml::EventListener_*>_>_>_>,_bool>
    ::
    pair<__gnu_cxx::__normal_iterator<std::pair<Rml::EventId,_Rml::EventListener_*>_*,_std::vector<std::pair<Rml::EventId,_Rml::EventListener_*>,_std::allocator<std::pair<Rml::EventId,_Rml::EventListener_*>_>_>_>_&,_bool,_true>
              ((pair<__gnu_cxx::__normal_iterator<std::pair<Rml::EventId,_Rml::EventListener_*>_*,_std::vector<std::pair<Rml::EventId,_Rml::EventListener_*>,_std::allocator<std::pair<Rml::EventId,_Rml::EventListener_*>_>_>_>,_bool>
                *)&this_local,&local_30,&local_39);
    uVar3 = extraout_RDX_00;
  }
  pVar4._9_7_ = (undefined7)((ulong)uVar3 >> 8);
  pVar4.second = local_10;
  pVar4.first._M_current = (pair<Rml::EventId,_Rml::EventListener_*> *)this_local;
  return pVar4;
}

Assistant:

std::pair<iterator, bool> insert(P&& val)
    {
        auto i = lower_bound(val.first);
        if (i != end() && !cmp()(val.first, *i))
        {
            return { i, false };
        }

        return{ m_container.emplace(i, std::forward<P>(val)), true };
    }